

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTable.cpp
# Opt level: O3

void __thiscall UnitTest_table5::Run(UnitTest_table5 *this)

{
  pointer pVVar1;
  bool bVar2;
  size_t sVar3;
  Value VVar4;
  Table t;
  Value key;
  string local_88;
  anon_union_8_9_8deb4486_for_Value_0 local_68;
  ValueT local_60;
  Table local_58;
  anon_union_8_9_8deb4486_for_Value_0 local_30;
  undefined4 local_28;
  
  luna::Table::Table(&local_58);
  local_30.obj_ = (GCObject *)0x0;
  local_28 = 0;
  local_68.obj_ = (GCObject *)0x0;
  local_60 = 2;
  for (sVar3 = 1; sVar3 != 5; sVar3 = sVar3 + 1) {
    local_68.num_ = (double)(int)sVar3;
    luna::Table::InsertArrayValue(&local_58,sVar3,(Value *)&local_68);
  }
  bVar2 = luna::Table::EraseArrayValue(&local_58,1);
  if (!bVar2) {
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"\'t.EraseArrayValue(1)\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
  }
  bVar2 = luna::Table::EraseArrayValue(&local_58,1);
  if (!bVar2) {
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"\'t.EraseArrayValue(1)\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
  }
  sVar3 = luna::Table::ArraySize(&local_58);
  if (sVar3 != 2) {
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"\'t.ArraySize() == 2\'","")
    ;
    UnitTestBase::Error(&this->super_UnitTestBase,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
  }
  local_28 = 2;
  local_30.num_ = 1.0;
  VVar4 = luna::Table::GetValue(&local_58,(Value *)&local_30);
  local_68 = VVar4.field_0;
  local_60 = VVar4.type_;
  if (local_60 != ValueT_Number) {
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"\'value.type_ == luna::ValueT_Number\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
  }
  if ((local_68.num_ != 3.0) || (NAN(local_68.num_))) {
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"\'value.num_ == 3\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
  }
  local_30.num_ = 2.0;
  VVar4 = luna::Table::GetValue(&local_58,(Value *)&local_30);
  local_68 = VVar4.field_0;
  local_60 = VVar4.type_;
  if (local_60 != ValueT_Number) {
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"\'value.type_ == luna::ValueT_Number\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
  }
  if ((local_68.num_ != 4.0) || (NAN(local_68.num_))) {
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"\'value.num_ == 4\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
  }
  local_58.super_GCObject._vptr_GCObject = (_func_int **)&PTR__Table_00188608;
  if (local_58.hash_._M_t.
      super___uniq_ptr_impl<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_*,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
      .
      super__Head_base<0UL,_std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_impl<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
       )0x0) {
    std::
    _Hashtable<luna::Value,_std::pair<const_luna::Value,_luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>,_std::__detail::_Select1st,_std::equal_to<luna::Value>,_std::hash<luna::Value>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<luna::Value,_std::pair<const_luna::Value,_luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>,_std::__detail::_Select1st,_std::equal_to<luna::Value>,_std::hash<luna::Value>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_58.hash_._M_t.
                     super___uniq_ptr_impl<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_*,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
                     .
                     super__Head_base<0UL,_std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_*,_false>
                     ._M_head_impl);
    operator_delete((void *)local_58.hash_._M_t.
                            super___uniq_ptr_impl<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_*,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
                            .
                            super__Head_base<0UL,_std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_*,_false>
                            ._M_head_impl);
  }
  local_58.hash_._M_t.
  super___uniq_ptr_impl<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_*,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
  .
  super__Head_base<0UL,_std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
          )0x0;
  if (local_58.array_._M_t.
      super___uniq_ptr_impl<std::vector<luna::Value,_std::allocator<luna::Value>_>,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::vector<luna::Value,_std::allocator<luna::Value>_>_*,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
      .super__Head_base<0UL,_std::vector<luna::Value,_std::allocator<luna::Value>_>_*,_false>.
      _M_head_impl !=
      (__uniq_ptr_impl<std::vector<luna::Value,_std::allocator<luna::Value>_>,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
       )0x0) {
    pVVar1 = (((_Vector_base<luna::Value,_std::allocator<luna::Value>_> *)
              local_58.array_._M_t.
              super___uniq_ptr_impl<std::vector<luna::Value,_std::allocator<luna::Value>_>,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::vector<luna::Value,_std::allocator<luna::Value>_>_*,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
              .
              super__Head_base<0UL,_std::vector<luna::Value,_std::allocator<luna::Value>_>_*,_false>
              ._M_head_impl)->_M_impl).super__Vector_impl_data._M_start;
    if (pVVar1 != (pointer)0x0) {
      operator_delete(pVVar1);
    }
    operator_delete((void *)local_58.array_._M_t.
                            super___uniq_ptr_impl<std::vector<luna::Value,_std::allocator<luna::Value>_>,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::vector<luna::Value,_std::allocator<luna::Value>_>_*,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
                            .
                            super__Head_base<0UL,_std::vector<luna::Value,_std::allocator<luna::Value>_>_*,_false>
                            ._M_head_impl);
  }
  local_58.array_._M_t.
  super___uniq_ptr_impl<std::vector<luna::Value,_std::allocator<luna::Value>_>,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<luna::Value,_std::allocator<luna::Value>_>_*,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
  .super__Head_base<0UL,_std::vector<luna::Value,_std::allocator<luna::Value>_>_*,_false>.
  _M_head_impl = (__uniq_ptr_data<std::vector<luna::Value,_std::allocator<luna::Value>_>,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::vector<luna::Value,_std::allocator<luna::Value>_>,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
                    )0x0;
  luna::GCObject::~GCObject(&local_58.super_GCObject);
  return;
}

Assistant:

TEST_CASE(table5)
{
    luna::Table t;
    luna::Value key;
    luna::Value value;

    value.type_ = luna::ValueT_Number;

    for (int i = 0; i < 4; ++i)
    {
        value.num_ = i + 1;
        t.InsertArrayValue(i + 1, value);
    }

    EXPECT_TRUE(t.EraseArrayValue(1));
    EXPECT_TRUE(t.EraseArrayValue(1));

    EXPECT_TRUE(t.ArraySize() == 2);

    key.type_ = luna::ValueT_Number;

    key.num_ = 1;
    value = t.GetValue(key);
    EXPECT_TRUE(value.type_ == luna::ValueT_Number);
    EXPECT_TRUE(value.num_ == 3);

    key.num_ = 2;
    value = t.GetValue(key);
    EXPECT_TRUE(value.type_ == luna::ValueT_Number);
    EXPECT_TRUE(value.num_ == 4);
}